

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

void avro::testLimits(EncoderPtr *e,DecoderPtr *d)

{
  bool bVar1;
  type pEVar2;
  element_type *peVar3;
  type pDVar4;
  element_type *peVar5;
  shared_ptr<avro::Decoder> *in_RSI;
  shared_ptr<avro::Encoder> *in_RDI;
  float fVar6;
  double dVar7;
  undefined1 auVar8 [16];
  auto_ptr<avro::InputStream> s2;
  auto_ptr<avro::OutputStream> s1;
  undefined1 uVar10;
  undefined8 uVar9;
  assertion_result *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  size_t in_stack_fffffffffffffcc0;
  size_t line_num;
  lazy_ostream *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  basic_cstring<const_char> local_2b0;
  basic_cstring<const_char> local_2a0;
  lazy_ostream local_290 [2];
  assertion_result local_270;
  basic_cstring<const_char> local_248;
  uint local_238;
  undefined4 local_234;
  undefined1 local_230 [8];
  basic_cstring<const_char> local_1e8;
  float local_1d8;
  undefined4 local_1d4;
  basic_cstring<const_char> local_1d0;
  undefined1 local_1c0 [56];
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  lazy_ostream local_158 [2];
  assertion_result local_138;
  basic_cstring<const_char> local_110;
  double local_100;
  element_type *local_f8;
  basic_cstring<const_char> local_f0;
  undefined1 local_e0 [56];
  basic_cstring<const_char> local_a8;
  double local_98;
  element_type *local_90;
  basic_cstring<const_char> local_88;
  undefined1 local_78 [56];
  basic_cstring<const_char> local_40;
  OutputStream local_30 [24];
  auto_ptr<avro::OutputStream> local_18;
  shared_ptr<avro::Decoder> *local_10;
  shared_ptr<avro::Encoder> *local_8;
  undefined1 extraout_var [12];
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  avro::memoryOutputStream((ulong)&local_18);
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(local_8);
  peVar3 = std::auto_ptr<avro::OutputStream>::operator*(&local_18);
  (**(code **)(*(long *)pEVar2 + 0x10))(pEVar2,peVar3);
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(local_8);
  std::numeric_limits<double>::infinity();
  (**(code **)(*(long *)pEVar2 + 0x48))();
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(local_8);
  dVar7 = std::numeric_limits<double>::infinity();
  (**(code **)(*(long *)pEVar2 + 0x48))(-dVar7);
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(local_8);
  std::numeric_limits<double>::quiet_NaN();
  (**(code **)(*(long *)pEVar2 + 0x48))();
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(local_8);
  std::numeric_limits<float>::infinity();
  (**(code **)(*(long *)pEVar2 + 0x40))();
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(local_8);
  auVar8._0_4_ = std::numeric_limits<float>::infinity();
  auVar8._4_12_ = extraout_var;
  (**(code **)(*(long *)pEVar2 + 0x40))(auVar8._0_8_ ^ 0x8000000080000000);
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(local_8);
  std::numeric_limits<float>::quiet_NaN();
  (**(code **)(*(long *)pEVar2 + 0x40))();
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(local_8);
  (**(code **)(*(long *)pEVar2 + 0x18))();
  std::auto_ptr<avro::OutputStream>::operator*(&local_18);
  avro::memoryInputStream(local_30);
  pDVar4 = boost::shared_ptr<avro::Decoder>::operator->(local_10);
  peVar5 = std::auto_ptr<avro::InputStream>::operator*((auto_ptr<avro::InputStream> *)local_30);
  (**(code **)(*(long *)pDVar4 + 0x10))(pDVar4,peVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc80);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (const_string *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               (const_string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc88,(char (*) [1])in_stack_fffffffffffffc80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    pDVar4 = boost::shared_ptr<avro::Decoder>::operator->(local_10);
    local_90 = (element_type *)(**(code **)(*(long *)pDVar4 + 0x40))();
    local_98 = std::numeric_limits<double>::infinity();
    in_stack_fffffffffffffc88 = "std::numeric_limits<double>::infinity()";
    in_stack_fffffffffffffc80 = (assertion_result *)&local_98;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_78,&local_88,0x5ca,1,2,&local_90,"d->decodeDouble()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238b7b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc80);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (const_string *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               (const_string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc88,(char (*) [1])in_stack_fffffffffffffc80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    pDVar4 = boost::shared_ptr<avro::Decoder>::operator->(local_10);
    local_f8 = (element_type *)(**(code **)(*(long *)pDVar4 + 0x40))();
    local_100 = std::numeric_limits<double>::infinity();
    local_100 = -local_100;
    in_stack_fffffffffffffc88 = "-std::numeric_limits<double>::infinity()";
    in_stack_fffffffffffffc80 = (assertion_result *)&local_100;
    uVar9 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_e0,&local_f0,0x5cc,1,2,&local_f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238cc3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar10 = (undefined1)((ulong)uVar9 >> 0x38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc80);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (const_string *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               (const_string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    pDVar4 = boost::shared_ptr<avro::Decoder>::operator->(local_10);
    (**(code **)(*(long *)pDVar4 + 0x40))();
    in_stack_fffffffffffffcd7 = boost::math::isnan<double>((double)in_stack_fffffffffffffc80);
    boost::test_tools::assertion_result::assertion_result(in_stack_fffffffffffffc80,(bool)uVar10);
    in_stack_fffffffffffffcc8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,"boost::math::isnan(d->decodeDouble())",0x25);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc88,
               (basic_cstring<const_char> *)in_stack_fffffffffffffc80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    uVar9 = 0;
    boost::test_tools::tt_detail::report_assertion
              (&local_138,local_158,&local_178,0x5cd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x238e17);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x238e24);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc80);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (const_string *)in_stack_fffffffffffffcc8,line_num,
               (const_string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc88,(char (*) [1])in_stack_fffffffffffffc80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    pDVar4 = boost::shared_ptr<avro::Decoder>::operator->(local_10);
    in_stack_fffffffffffffcbc = (**(code **)(*(long *)pDVar4 + 0x38))();
    local_1d4 = in_stack_fffffffffffffcbc;
    local_1d8 = std::numeric_limits<float>::infinity();
    in_stack_fffffffffffffc88 = "std::numeric_limits<float>::infinity()";
    in_stack_fffffffffffffc80 = (assertion_result *)&local_1d8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
              (local_1c0,&local_1d0,0x5cf,1,2,&local_1d4,"d->decodeFloat()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238f61);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc80);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (const_string *)in_stack_fffffffffffffcc8,line_num,
               (const_string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc88,(char (*) [1])in_stack_fffffffffffffc80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    pDVar4 = boost::shared_ptr<avro::Decoder>::operator->(local_10);
    local_234 = (**(code **)(*(long *)pDVar4 + 0x38))();
    fVar6 = std::numeric_limits<float>::infinity();
    local_238 = (uint)fVar6 ^ (uint)DAT_002c0b00;
    in_stack_fffffffffffffc88 = "-std::numeric_limits<float>::infinity()";
    in_stack_fffffffffffffc80 = (assertion_result *)&local_238;
    uVar9 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
              (&stack0xfffffffffffffde0,local_230,0x5d1,1,2,&local_234);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2390a9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar10 = (undefined1)((ulong)uVar9 >> 0x38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc80);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
               (const_string *)in_stack_fffffffffffffcc8,line_num,
               (const_string *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    pDVar4 = boost::shared_ptr<avro::Decoder>::operator->(local_10);
    (**(code **)(*(long *)pDVar4 + 0x38))();
    boost::math::isnan<float>(0.0);
    boost::test_tools::assertion_result::assertion_result(in_stack_fffffffffffffc80,(bool)uVar10);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,"boost::math::isnan(d->decodeFloat())",0x24);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc88,
               (basic_cstring<const_char> *)in_stack_fffffffffffffc80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
               ,0x6d);
    uVar9 = 0;
    boost::test_tools::tt_detail::report_assertion
              (&local_270,local_290,&local_2b0,0x5d2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x2391fd);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x23920a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::auto_ptr<avro::InputStream>::~auto_ptr
            ((auto_ptr<avro::InputStream> *)in_stack_fffffffffffffc80);
  std::auto_ptr<avro::OutputStream>::~auto_ptr
            ((auto_ptr<avro::OutputStream> *)in_stack_fffffffffffffc80);
  return;
}

Assistant:

static void testLimits(const EncoderPtr& e, const DecoderPtr& d)
{
    std::auto_ptr<OutputStream> s1 = memoryOutputStream();
    {
        e->init(*s1);
        e->encodeDouble(std::numeric_limits<double>::infinity());
        e->encodeDouble(-std::numeric_limits<double>::infinity());
        e->encodeDouble(std::numeric_limits<double>::quiet_NaN());
        e->encodeFloat(std::numeric_limits<float>::infinity());
        e->encodeFloat(-std::numeric_limits<float>::infinity());
        e->encodeFloat(std::numeric_limits<float>::quiet_NaN());
        e->flush();
    }

    {
        std::auto_ptr<InputStream> s2 = memoryInputStream(*s1);
        d->init(*s2);
        BOOST_CHECK_EQUAL(d->decodeDouble(),
            std::numeric_limits<double>::infinity());
        BOOST_CHECK_EQUAL(d->decodeDouble(),
            -std::numeric_limits<double>::infinity());
        BOOST_CHECK(boost::math::isnan(d->decodeDouble()));
        BOOST_CHECK_EQUAL(d->decodeFloat(),
            std::numeric_limits<float>::infinity());
        BOOST_CHECK_EQUAL(d->decodeFloat(),
            -std::numeric_limits<float>::infinity());
        BOOST_CHECK(boost::math::isnan(d->decodeFloat()));
    }

}